

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlledFragmentAssembler.h
# Opt level: O1

ControlledPollAction __thiscall
aeron::ControlledFragmentAssembler::onFragment
          (ControlledFragmentAssembler *this,AtomicBuffer *buffer,index_t offset,index_t length,
          Header *header)

{
  AtomicBuffer *this_00;
  uint8_t **ppuVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ControlledPollAction CVar7;
  _Node_iterator<std::pair<const_int,_aeron::BufferBuilder>,_false,_false> _Var8;
  _Hash_node_base *p_Var9;
  ulong uVar10;
  __node_base_ptr p_Var11;
  __node_base_ptr p_Var12;
  uint32_t additionalCapacity;
  uint uVar13;
  uint32_t uVar14;
  pair<std::__detail::_Node_iterator<std::pair<const_int,_aeron::BufferBuilder>,_false,_false>,_bool>
  pVar15;
  Header assemblyHeader;
  AtomicBuffer msgBuffer;
  int local_a0 [2];
  ulong local_98;
  Header local_90;
  BufferBuilder *local_60;
  index_t *local_58;
  uint8_t **local_50;
  AtomicBuffer local_48;
  
  this_00 = &header->m_buffer;
  iVar3 = header->m_offset;
  concurrent::AtomicBuffer::boundsCheck(this_00,iVar3 + 5,1);
  bVar2 = (header->m_buffer).m_buffer[(long)iVar3 + 5];
  if (bVar2 < 0xc0) {
    local_58 = &header->m_offset;
    ppuVar1 = &(header->m_buffer).m_buffer;
    local_98 = (ulong)(uint)length;
    if ((char)bVar2 < '\0') {
      iVar3 = *local_58;
      concurrent::AtomicBuffer::boundsCheck(this_00,iVar3 + 0xc,4);
      local_90.m_context =
           (void *)CONCAT44(local_90.m_context._4_4_,*(undefined4 *)(*ppuVar1 + (long)iVar3 + 0xc));
      local_48._vptr_AtomicBuffer._0_4_ = (index_t)this->m_initialBufferLength;
      pVar15 = std::
               _Hashtable<int,std::pair<int_const,aeron::BufferBuilder>,std::allocator<std::pair<int_const,aeron::BufferBuilder>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               ::_M_emplace<int,unsigned_int>
                         ((_Hashtable<int,std::pair<int_const,aeron::BufferBuilder>,std::allocator<std::pair<int_const,aeron::BufferBuilder>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                           *)&this->m_builderBySessionIdMap);
      uVar5 = local_98;
      _Var8 = pVar15.first.
              super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>._M_cur;
      *(undefined4 *)
       ((long)_Var8.super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>.
              _M_cur + 0x1c) = 0x20;
      uVar14 = (uint32_t)local_98;
      BufferBuilder::ensureCapacity
                ((BufferBuilder *)
                 ((long)_Var8.
                        super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>
                        ._M_cur + 0x10),uVar14);
      memcpy((void *)((ulong)*(uint *)((long)_Var8.
                                             super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>
                                             ._M_cur + 0x1c) +
                     *(long *)((long)_Var8.
                                     super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>
                                     ._M_cur + 0x20)),buffer->m_buffer + offset,uVar5 & 0xffffffff);
      *(int *)((long)_Var8.
                     super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>.
                     _M_cur + 0x1c) =
           *(int *)((long)_Var8.
                          super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>
                          ._M_cur + 0x1c) + uVar14;
      CVar7 = CONTINUE;
    }
    else {
      iVar3 = *local_58;
      concurrent::AtomicBuffer::boundsCheck(this_00,iVar3 + 0xc,4);
      uVar6 = local_98;
      iVar3 = *(int *)(*ppuVar1 + (long)iVar3 + 0xc);
      uVar5 = (this->m_builderBySessionIdMap)._M_h._M_bucket_count;
      uVar10 = (ulong)(long)iVar3 % uVar5;
      p_Var11 = (this->m_builderBySessionIdMap)._M_h._M_buckets[uVar10];
      p_Var12 = (__node_base_ptr)0x0;
      if ((p_Var11 != (__node_base_ptr)0x0) &&
         (p_Var9 = p_Var11->_M_nxt, p_Var12 = p_Var11, iVar3 != *(int *)&p_Var11->_M_nxt[1]._M_nxt))
      {
        while (p_Var11 = p_Var9, p_Var9 = p_Var11->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
          p_Var12 = (__node_base_ptr)0x0;
          if (((ulong)(long)*(int *)&p_Var9[1]._M_nxt % uVar5 != uVar10) ||
             (p_Var12 = p_Var11, iVar3 == *(int *)&p_Var9[1]._M_nxt)) goto LAB_0013bef7;
        }
        p_Var12 = (__node_base_ptr)0x0;
      }
LAB_0013bef7:
      if (p_Var12 == (__node_base_ptr)0x0) {
        p_Var9 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var9 = p_Var12->_M_nxt;
      }
      CVar7 = CONTINUE;
      if ((p_Var9 != (_Hash_node_base *)0x0) &&
         (uVar14 = *(uint32_t *)((long)&p_Var9[3]._M_nxt + 4), uVar14 != 0x20)) {
        local_60 = (BufferBuilder *)(p_Var9 + 2);
        additionalCapacity = (uint32_t)local_98;
        local_50 = ppuVar1;
        BufferBuilder::ensureCapacity(local_60,additionalCapacity);
        memcpy((void *)((long)&(p_Var9[4]._M_nxt)->_M_nxt +
                       (ulong)*(uint *)((long)&p_Var9[3]._M_nxt + 4)),buffer->m_buffer + offset,
               uVar6 & 0xffffffff);
        uVar13 = additionalCapacity + *(int *)((long)&p_Var9[3]._M_nxt + 4);
        *(uint *)((long)&p_Var9[3]._M_nxt + 4) = uVar13;
        if (0x3f < bVar2) {
          concurrent::AtomicBuffer::AtomicBuffer
                    (&local_48,(uint8_t *)p_Var9[4]._M_nxt,(ulong)uVar13);
          local_90.m_context = header->m_context;
          local_90.m_buffer._vptr_AtomicBuffer = (_func_int **)&PTR__AtomicBuffer_001631c8;
          local_90.m_positionBitsToShift = local_58[2];
          local_90.m_buffer.m_buffer = local_48.m_buffer;
          local_90.m_buffer.m_length = local_48.m_length;
          local_90._32_8_ = *(ulong *)local_58 & 0xffffffff00000000;
          concurrent::AtomicBuffer::boundsCheck(&local_48,0,0x20);
          *(uint *)local_48.m_buffer = uVar13;
          iVar3 = header->m_offset;
          concurrent::AtomicBuffer::boundsCheck(this_00,iVar3 + 0xc,4);
          *(uint *)((long)local_48.m_buffer + 0xc) =
               *(uint *)((header->m_buffer).m_buffer + (long)iVar3 + 0xc);
          iVar3 = header->m_offset;
          concurrent::AtomicBuffer::boundsCheck(this_00,iVar3 + 0x10,4);
          *(uint *)((long)local_48.m_buffer + 0x10) =
               *(uint *)((header->m_buffer).m_buffer + (long)iVar3 + 0x10);
          iVar3 = header->m_offset;
          concurrent::AtomicBuffer::boundsCheck(this_00,iVar3 + 0x14,4);
          *(uint *)((long)local_48.m_buffer + 0x14) =
               *(uint *)((header->m_buffer).m_buffer + (long)iVar3 + 0x14);
          *(undefined1 *)((long)local_48.m_buffer + 5) = 0xc0;
          *(undefined2 *)((long)local_48.m_buffer + 6) = 1;
          iVar3 = header->m_offset;
          uVar4 = *(uint *)local_48.m_buffer;
          concurrent::AtomicBuffer::boundsCheck(this_00,iVar3,4);
          *(uint *)((long)local_48.m_buffer + 8) =
               (iVar3 - uVar4) + *(int *)((header->m_buffer).m_buffer + iVar3);
          local_a0[1] = 0x20;
          local_a0[0] = uVar13 - 0x20;
          if ((this->m_delegate).super__Function_base._M_manager == (_Manager_type)0x0)
          goto LAB_0013c10f;
          CVar7 = (*(this->m_delegate)._M_invoker)
                            ((_Any_data *)&this->m_delegate,&local_48,local_a0 + 1,local_a0,
                             &local_90);
          if (CVar7 == ABORT) {
            BufferBuilder::limit(local_60,uVar14);
          }
          else {
            *(undefined4 *)((long)&p_Var9[3]._M_nxt + 4) = 0x20;
          }
        }
      }
    }
  }
  else {
    local_90.m_context = (void *)CONCAT44(local_90.m_context._4_4_,offset);
    local_48._vptr_AtomicBuffer._0_4_ = length;
    if ((this->m_delegate).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_0013c10f:
      std::__throw_bad_function_call();
    }
    CVar7 = (*(this->m_delegate)._M_invoker)
                      ((_Any_data *)&this->m_delegate,buffer,(int *)&local_90,(int *)&local_48,
                       header);
  }
  return CVar7;
}

Assistant:

ControlledPollAction onFragment(AtomicBuffer& buffer, util::index_t offset, util::index_t length, Header& header)
    {
        const std::uint8_t flags = header.flags();
        ControlledPollAction action = ControlledPollAction::CONTINUE;

        if ((flags & FrameDescriptor::UNFRAGMENTED) == FrameDescriptor::UNFRAGMENTED)
        {
            action = m_delegate(buffer, offset, length, header);
        }
        else
        {
            if ((flags & FrameDescriptor::BEGIN_FRAG) == FrameDescriptor::BEGIN_FRAG)
            {
                auto result = m_builderBySessionIdMap.emplace(header.sessionId(), static_cast<std::uint32_t>(m_initialBufferLength));
                BufferBuilder& builder = result.first->second;

                builder
                    .reset()
                    .append(buffer, offset, length, header);
            }
            else
            {
                auto result = m_builderBySessionIdMap.find(header.sessionId());

                if (result != m_builderBySessionIdMap.end())
                {
                    BufferBuilder& builder = result->second;
                    const std::uint32_t limit = builder.limit();

                    if (builder.limit() != DataFrameHeader::LENGTH)
                    {
                        builder.append(buffer, offset, length, header);

                        if ((flags & FrameDescriptor::END_FRAG) == FrameDescriptor::END_FRAG)
                        {
                            const util::index_t msgLength = builder.limit() - DataFrameHeader::LENGTH;
                            AtomicBuffer msgBuffer(builder.buffer(), builder.limit());
                            Header assemblyHeader(header);

                            assemblyHeader.buffer(msgBuffer);
                            assemblyHeader.offset(0);
                            DataFrameHeader::DataFrameHeaderDefn& frame(
                                msgBuffer.overlayStruct<DataFrameHeader::DataFrameHeaderDefn>());

                            frame.frameLength = DataFrameHeader::LENGTH + msgLength;
                            frame.sessionId = header.sessionId();
                            frame.streamId = header.streamId();
                            frame.termId = header.termId();
                            frame.flags = FrameDescriptor::UNFRAGMENTED;
                            frame.type = DataFrameHeader::HDR_TYPE_DATA;
                            frame.termOffset = header.termOffset() - (frame.frameLength - header.frameLength());

                            action = m_delegate(msgBuffer, DataFrameHeader::LENGTH, msgLength, assemblyHeader);

                            if (ControlledPollAction::ABORT == action)
                            {
                                builder.limit(limit);
                            }
                            else
                            {
                                builder.reset();
                            }
                        }
                    }
                }
            }
        }

        return action;
    }